

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void wasm::PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::scan
               (Poppifier *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  _func_void_Poppifier_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                       ,0x103);
  case BlockId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitBlock,currp);
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
LAB_009f6b97:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                    ,0x31b,__function);
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) {
LAB_009f67cc:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
                  ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
                   wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
                   scan(Poppifier*,wasm::Expression___,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case IfId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitIf,currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_009f6b97;
    }
    local_38 = pEVar1 + 2;
    local_40 = wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,wasm::Visitor<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,wasm::Visitor<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,void>>::Task,10ul>
                  *)&(self->super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>).
                     super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    goto LAB_009f6615;
  case LoopId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitLoop,currp);
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_009f6b97;
    }
    goto LAB_009f60f0;
  case BreakId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitBreak,currp);
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_009f6b97;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,wasm::Visitor<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,wasm::Visitor<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,void>>::Task,10ul>
                  *)&(self->super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>).
                     super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_009f5f54;
  case SwitchId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitSwitch,currp);
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_009f6b97;
    }
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar4 = *(long *)(pEVar1 + 4);
    goto joined_r0x009f5f4e;
  case CallId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitCall,currp);
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_009f6b97;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_009f67cc;
        Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
                  ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
                   wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
                   scan(Poppifier*,wasm::Expression___,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case CallIndirectId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitCallIndirect,currp);
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_009f6b97;
    }
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 2) <= uVar3 - 2) goto LAB_009f67cc;
        Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
                  ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
                   wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
                   scan(Poppifier*,wasm::Expression___,(Expression **)(pEVar1[1].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case LocalGetId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitLocalGet,currp);
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_009f6b97;
    }
    break;
  case LocalSetId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitLocalSet,currp);
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_009f6b97;
    }
    goto LAB_009f6707;
  case GlobalGetId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitGlobalGet,currp);
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_009f6b97;
    }
    break;
  case GlobalSetId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitGlobalSet,currp);
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_009f6b97;
    }
    goto LAB_009f60f0;
  case LoadId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitLoad,currp);
    if (pEVar1->_id != LoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Load]";
      goto LAB_009f6b97;
    }
    pEVar1 = pEVar1 + 3;
    goto LAB_009f6715;
  case StoreId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStore,currp);
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_009f6b97;
    }
    goto LAB_009f63b4;
  case ConstId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitConst,currp);
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_009f6b97;
    }
    break;
  case UnaryId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitUnary,currp);
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_009f6b97;
    }
    goto LAB_009f6707;
  case BinaryId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitBinary,currp);
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_009f6b97;
    }
    goto LAB_009f634b;
  case SelectId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitSelect,currp);
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_009f6b97;
    }
    goto LAB_009f6606;
  case DropId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitDrop,currp);
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_009f6b97;
    }
    goto LAB_009f61ac;
  case ReturnId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitReturn,currp);
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_009f6b97;
    }
    goto LAB_009f5f45;
  case MemorySizeId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitMemorySize,currp);
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_009f6b97;
    }
    break;
  case MemoryGrowId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitMemoryGrow,currp);
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_009f6b97;
    }
    goto LAB_009f61ac;
  case NopId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitNop,currp);
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_009f6b97;
    }
    break;
  case UnreachableId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitUnreachable,currp);
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_009f6b97;
    }
    break;
  case AtomicRMWId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitAtomicRMW,currp);
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_009f6b97;
    }
    goto LAB_009f6437;
  case AtomicCmpxchgId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitAtomicCmpxchg,currp);
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_009f6b97;
    }
    goto LAB_009f6428;
  case AtomicWaitId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitAtomicWait,currp);
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_009f6b97;
    }
    goto LAB_009f6111;
  case AtomicNotifyId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitAtomicNotify,currp);
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_009f6b97;
    }
    goto LAB_009f634b;
  case AtomicFenceId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitAtomicFence,currp);
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_009f6b97;
    }
    break;
  case SIMDExtractId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitSIMDExtract,currp);
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_009f6b97;
    }
    goto LAB_009f6707;
  case SIMDReplaceId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitSIMDReplace,currp);
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_009f6b97;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_009f6356;
  case SIMDShuffleId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitSIMDShuffle,currp);
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_009f6b97;
    }
    goto LAB_009f6615;
  case SIMDTernaryId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitSIMDTernary,currp);
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_009f6b97;
    }
    goto LAB_009f6111;
  case SIMDShiftId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitSIMDShift,currp);
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_009f6b97;
    }
    goto LAB_009f634b;
  case SIMDLoadId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitSIMDLoad,currp);
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_009f6b97;
    }
    goto LAB_009f62d0;
  case SIMDLoadStoreLaneId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitSIMDLoadStoreLane,currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_009f6b97;
    }
LAB_009f63b4:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_009f6715;
  case MemoryInitId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitMemoryInit,currp);
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_009f6b97;
    }
    goto LAB_009f6428;
  case DataDropId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitDataDrop,currp);
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_009f6b97;
    }
    break;
  case MemoryCopyId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitMemoryCopy,currp);
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_009f6b97;
    }
    goto LAB_009f6606;
  case MemoryFillId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitMemoryFill,currp);
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_009f6b97;
    }
    goto LAB_009f6606;
  case PopId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitPop,currp);
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_009f6b97;
    }
    break;
  case RefNullId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitRefNull,currp);
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_009f6b97;
    }
    break;
  case RefIsNullId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitRefIsNull,currp);
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_009f6b97;
    }
    goto LAB_009f61ac;
  case RefFuncId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitRefFunc,currp);
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_009f6b97;
    }
    break;
  case RefEqId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitRefEq,currp);
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_009f6b97;
    }
    goto LAB_009f6615;
  case TableGetId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitTableGet,currp);
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_009f6b97;
    }
    goto LAB_009f60f0;
  case TableSetId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitTableSet,currp);
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_009f6b97;
    }
    goto LAB_009f6437;
  case TableSizeId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitTableSize,currp);
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_009f6b97;
    }
    break;
  case TableGrowId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitTableGrow,currp);
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_009f6b97;
    }
    goto LAB_009f6437;
  case TableFillId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitTableFill,currp);
    if (pEVar1->_id != TableFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableFill]";
      goto LAB_009f6b97;
    }
    goto LAB_009f6428;
  case TableCopyId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitTableCopy,currp);
    if (pEVar1->_id != TableCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableCopy]";
      goto LAB_009f6b97;
    }
    goto LAB_009f6606;
  case TableInitId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitTableInit,currp);
    if (pEVar1->_id != TableInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableInit]";
      goto LAB_009f6b97;
    }
    goto LAB_009f6428;
  case TryId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitTry,currp);
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_009f6b97;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 5) <= uVar3 - 2) goto LAB_009f67cc;
        Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
                  ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
                   wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
                   scan(Poppifier*,wasm::Expression___,(Expression **)(pEVar1[4].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
LAB_009f60f0:
    pEVar1 = pEVar1 + 2;
    goto LAB_009f6715;
  case TryTableId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitTryTable,currp);
    if (pEVar1->_id != TryTableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TryTable]";
      goto LAB_009f6b97;
    }
    goto LAB_009f61ac;
  case ThrowId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitThrow,currp);
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_009f6b97;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_009f67cc;
        Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
                  ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
                   wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
                   scan(Poppifier*,wasm::Expression___,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RethrowId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitRethrow,currp);
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_009f6b97;
    }
    break;
  case ThrowRefId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitThrowRef,currp);
    if (pEVar1->_id != ThrowRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ThrowRef]";
      goto LAB_009f6b97;
    }
    goto LAB_009f61ac;
  case TupleMakeId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitTupleMake,currp);
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_009f6b97;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_009f67cc;
        Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
                  ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
                   wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
                   scan(Poppifier*,wasm::Expression___,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case TupleExtractId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitTupleExtract,currp);
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_009f6b97;
    }
    goto LAB_009f61ac;
  case RefI31Id:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitRefI31,currp);
    if (pEVar1->_id != RefI31Id) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefI31]";
      goto LAB_009f6b97;
    }
    goto LAB_009f61ac;
  case I31GetId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitI31Get,currp);
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_009f6b97;
    }
    goto LAB_009f61ac;
  case CallRefId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitCallRef,currp);
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_009f6b97;
    }
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_009f67cc;
        Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
                  ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
                   wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
                   scan(Poppifier*,wasm::Expression___,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RefTestId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitRefTest,currp);
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_009f6b97;
    }
    goto LAB_009f61ac;
  case RefCastId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitRefCast,currp);
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_009f6b97;
    }
    goto LAB_009f61ac;
  case BrOnId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitBrOn,currp);
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_009f6b97;
    }
LAB_009f62d0:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_009f6715;
  case StructNewId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStructNew,currp);
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_009f6b97;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_009f67cc;
        Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
                  ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
                   wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
                   scan(Poppifier*,wasm::Expression___,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case StructGetId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStructGet,currp);
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_009f6b97;
    }
    goto LAB_009f6707;
  case StructSetId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStructSet,currp);
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_009f6b97;
    }
    goto LAB_009f634b;
  case StructRMWId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStructRMW,currp);
    if (pEVar1->_id != StructRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructRMW]";
      goto LAB_009f6b97;
    }
    goto LAB_009f634b;
  case StructCmpxchgId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStructCmpxchg,currp);
    if (pEVar1->_id != StructCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructCmpxchg]";
      goto LAB_009f6b97;
    }
LAB_009f6111:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_009f6356;
  case ArrayNewId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitArrayNew,currp);
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_009f6b97;
    }
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)&pEVar1[1].type);
LAB_009f5f45:
    local_38 = pEVar1 + 1;
    lVar4 = *(long *)(pEVar1 + 1);
joined_r0x009f5f4e:
    if (lVar4 != 0) {
LAB_009f5f54:
      local_40 = wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
                 scan(Poppifier*,wasm::Expression___;
      SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,wasm::Visitor<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,wasm::Visitor<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,void>>::Task,10ul>
                  *)&(self->super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>).
                     super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    break;
  case ArrayNewDataId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitArrayNewData,currp);
    if (pEVar1->_id != ArrayNewDataId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewData]";
      goto LAB_009f6b97;
    }
    goto LAB_009f6437;
  case ArrayNewElemId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitArrayNewElem,currp);
    if (pEVar1->_id != ArrayNewElemId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewElem]";
      goto LAB_009f6b97;
    }
    goto LAB_009f6437;
  case ArrayNewFixedId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitArrayNewFixed,currp);
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_009f6b97;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_009f67cc;
        Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
                  ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
                   wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
                   scan(Poppifier*,wasm::Expression___,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ArrayGetId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitArrayGet,currp);
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_009f6b97;
    }
    goto LAB_009f6615;
  case ArraySetId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitArraySet,currp);
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_009f6b97;
    }
    goto LAB_009f6606;
  case ArrayLenId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitArrayLen,currp);
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_009f6b97;
    }
    goto LAB_009f61ac;
  case ArrayCopyId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitArrayCopy,currp);
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_009f6b97;
    }
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)(pEVar1 + 3));
    goto LAB_009f65f7;
  case ArrayFillId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitArrayFill,currp);
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_009f6b97;
    }
LAB_009f65f7:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)&pEVar1[2].type);
    goto LAB_009f6606;
  case ArrayInitDataId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitArrayInitData,currp);
    if (pEVar1->_id != ArrayInitDataId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInitData]";
      goto LAB_009f6b97;
    }
    goto LAB_009f5a3c;
  case ArrayInitElemId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitArrayInitElem,currp);
    if (pEVar1->_id != ArrayInitElemId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInitElem]";
      goto LAB_009f6b97;
    }
LAB_009f5a3c:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)&pEVar1[3].type);
LAB_009f6428:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)(pEVar1 + 3));
LAB_009f6437:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_009f6715;
  case RefAsId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitRefAs,currp);
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_009f6b97;
    }
    goto LAB_009f6707;
  case StringNewId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStringNew,currp);
    if (pEVar1->_id != StringNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
      goto LAB_009f6b97;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,wasm::Visitor<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,wasm::Visitor<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,void>>::Task,10ul>
                  *)&(self->super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>).
                     super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    local_40 = wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,wasm::Visitor<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,wasm::Visitor<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,void>>::Task,10ul>
                  *)&(self->super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>).
                     super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    goto LAB_009f6707;
  case StringConstId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStringConst,currp);
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_009f6b97;
    }
    break;
  case StringMeasureId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStringMeasure,currp);
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_009f6b97;
    }
LAB_009f6707:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_009f6715;
  case StringEncodeId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStringEncode,currp);
    if (pEVar1->_id != StringEncodeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
      goto LAB_009f6b97;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,wasm::Visitor<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,wasm::Visitor<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,void>>::Task,10ul>
                  *)&(self->super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>).
                     super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    goto LAB_009f634b;
  case StringConcatId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStringConcat,currp);
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_009f6b97;
    }
    goto LAB_009f6615;
  case StringEqId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStringEq,currp);
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_009f6b97;
    }
LAB_009f634b:
    currp_00 = pEVar1 + 2;
LAB_009f6356:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)currp_00);
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_009f6715;
  case StringWTF16GetId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStringWTF16Get,currp);
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_009f6b97;
    }
    goto LAB_009f6615;
  case StringSliceWTFId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStringSliceWTF,currp);
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_009f6b97;
    }
LAB_009f6606:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)(pEVar1 + 2));
LAB_009f6615:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_009f6715;
  case ContNewId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitContNew,currp);
    if (pEVar1->_id != ContNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ContNew]";
      goto LAB_009f6b97;
    }
LAB_009f61ac:
    pEVar1 = pEVar1 + 1;
LAB_009f6715:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)pEVar1);
    return;
  case ContBindId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitContBind,currp);
    if (pEVar1->_id != ContBindId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ContBind]";
      goto LAB_009f6b97;
    }
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_009f67cc;
        Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
                  ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
                   wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
                   scan(Poppifier*,wasm::Expression___,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case SuspendId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitSuspend,currp);
    if (pEVar1->_id != SuspendId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Suspend]";
      goto LAB_009f6b97;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_009f67cc;
        Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
                  ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
                   wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
                   scan(Poppifier*,wasm::Expression___,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ResumeId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitResume,currp);
    if (pEVar1->_id != ResumeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Resume]";
      goto LAB_009f6b97;
    }
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)(pEVar1 + 7));
    uVar2 = (uint)pEVar1[5].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[5].type.id <= uVar3 - 2) goto LAB_009f67cc;
        Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
                  ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
                   wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
                   scan(Poppifier*,wasm::Expression___,
                   (Expression **)(*(long *)(pEVar1 + 5) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ResumeThrowId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitResumeThrow,currp);
    if (pEVar1->_id != ResumeThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ResumeThrow]";
      goto LAB_009f6b97;
    }
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)(pEVar1 + 8));
    uVar2 = (uint)pEVar1[6].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[6].type.id <= uVar3 - 2) goto LAB_009f67cc;
        Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
                  ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
                   wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
                   scan(Poppifier*,wasm::Expression___,
                   (Expression **)(*(long *)(pEVar1 + 6) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case StackSwitchId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStackSwitch,currp);
    if (pEVar1->_id != StackSwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StackSwitch]";
      goto LAB_009f6b97;
    }
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)(pEVar1 + 4));
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_009f67cc;
        Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
                  ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
                   wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
                   scan(Poppifier*,wasm::Expression___,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }